

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int av1_pack_bitstream(AV1_COMP *cpi,uint8_t *dst,size_t dst_size,size_t *size,int *largest_tile_id)

{
  long lVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  AV1_COMMON *cm_00;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  long *in_RCX;
  ulong in_RDX;
  uint8_t *in_RSI;
  long *in_RDI;
  size_t bytes_written_2;
  size_t length_field;
  aom_write_bit_buffer saved_wb;
  int write_frame_header;
  size_t bytes_written_1;
  size_t bytes_written;
  size_t length_field_size;
  uint8_t obu_extension_header;
  FrameHeaderInfo fh_info;
  uint32_t obu_payload_size;
  uint32_t obu_header_size;
  AV1LevelParams *level_params;
  AV1_COMMON *cm;
  size_t data_size;
  uint8_t *data;
  uint8_t *puVar9;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint append_trailing_bits;
  uint8_t *in_stack_ffffffffffffff48;
  uint8_t obu_extension_header_00;
  size_t in_stack_ffffffffffffff50;
  aom_write_bit_buffer *saved_wb_00;
  MACROBLOCKD *in_stack_ffffffffffffff58;
  AV1_COMP *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar10;
  int *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  AV1_COMP *in_stack_ffffffffffffff98;
  ulong local_40;
  uint8_t *local_38;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  lVar1 = *in_RDI;
  memset(&stack0xffffffffffffff90,0,0x18);
  bVar2 = (byte)(*(int *)((long)in_RDI + 0x4230c) << 5) | (byte)((int)in_RDI[0x8462] << 3);
  if (((int)in_RDI[0x83da] != 0) && (*(int *)((long)in_RDI + 0x9d304) == 0)) {
    *(undefined4 *)(in_RDI + 0x83da) = 0;
  }
  *(undefined4 *)(in_RDI + 0x13a60) = 0;
  if (((cm_00->current_frame).frame_type == '\x02') ||
     (local_40 = in_RDX, local_38 = in_RSI, (cm_00->current_frame).frame_type == '\0')) {
    if (in_RDX < 2) {
      return 1;
    }
    puVar9 = in_RSI;
    uVar3 = av1_write_obu_header
                      ((AV1LevelParams *)(lVar1 + 0x5a90),(int *)(in_RDI + 0x13a60),
                       OBU_SEQUENCE_HEADER,(_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),false,0,
                       in_RSI);
    uVar4 = av1_write_sequence_header_obu
                      ((SequenceHeader *)in_stack_ffffffffffffff60,
                       (uint8_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff80 =
         (int *)obu_memmove(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (size_t)in_stack_ffffffffffffff60,(uint8_t *)in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff50);
    if (in_stack_ffffffffffffff80 == (int *)0x0) {
      return 1;
    }
    iVar5 = av1_write_uleb_obu_size
                      ((size_t)in_stack_ffffffffffffff48,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (size_t)puVar9);
    if (iVar5 != 0) {
      return 1;
    }
    lVar6 = (long)in_stack_ffffffffffffff80 + (ulong)uVar4 + (ulong)uVar3;
    local_38 = in_RSI + lVar6;
    local_40 = in_RDX - lVar6;
  }
  if ((int)in_RDI[0x782c] != 0) {
    sVar7 = av1_write_metadata_array
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       CONCAT17(bVar2,in_stack_ffffffffffffff88));
    local_38 = local_38 + sVar7;
    local_40 = local_40 - sVar7;
  }
  append_trailing_bits = CONCAT13(1,(int3)in_stack_ffffffffffffff44);
  if (*(int *)((long)in_RDI + 0x9d4c4) < 2) {
    iVar5 = encode_show_existing_frame(cm_00);
    append_trailing_bits = CONCAT13(iVar5 != 0,(int3)append_trailing_bits);
  }
  uVar10 = append_trailing_bits >> 0x18;
  memset(&stack0xffffffffffffff58,0,0x10);
  saved_wb_00 = (aom_write_bit_buffer *)0x0;
  if (uVar10 != 0) {
    if (local_40 < 2) {
      return 1;
    }
    puVar9 = local_38;
    uVar3 = av1_write_obu_header
                      ((AV1LevelParams *)(lVar1 + 0x5a90),(int *)(in_RDI + 0x13a60),OBU_FRAME_HEADER
                       ,(_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),true,(uint)bVar2,local_38);
    uVar4 = write_frame_header_obu
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,saved_wb_00,
                       in_stack_ffffffffffffff48,append_trailing_bits);
    saved_wb_00 = (aom_write_bit_buffer *)
                  obu_memmove(CONCAT44(uVar10,in_stack_ffffffffffffff68),
                              (size_t)in_stack_ffffffffffffff60,(uint8_t *)in_stack_ffffffffffffff58
                              ,(size_t)saved_wb_00);
    if (saved_wb_00 == (aom_write_bit_buffer *)0x0) {
      return 1;
    }
    iVar5 = av1_write_uleb_obu_size
                      ((size_t)in_stack_ffffffffffffff48,
                       (uint8_t *)CONCAT44(append_trailing_bits,in_stack_ffffffffffffff40),
                       (size_t)puVar9);
    if (iVar5 != 0) {
      return 1;
    }
    uVar8 = (long)&saved_wb_00->bit_buffer + (ulong)uVar4 + (ulong)uVar3;
    if (0xffffffff < uVar8) {
      return 1;
    }
    local_38 = local_38 + uVar8;
  }
  obu_extension_header_00 = (uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  iVar5 = encode_show_existing_frame(cm_00);
  if (iVar5 == 0) {
    if (in_stack_ffffffffffffff58 != (MACROBLOCKD *)0x0) {
      in_stack_ffffffffffffff58 =
           (MACROBLOCKD *)
           ((long)&(saved_wb_00 + -1)[-3].bit_buffer +
           (long)&in_stack_ffffffffffffff58->plane[0].pre[0].buf);
    }
    uVar3 = write_tiles_in_tg_obus
                      ((AV1_COMP *)CONCAT44(uVar10,in_stack_ffffffffffffff68),
                       (uint8_t *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                       saved_wb_00,obu_extension_header_00,
                       (FrameHeaderInfo *)CONCAT44(append_trailing_bits,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff80);
    local_38 = local_38 + uVar3;
  }
  *in_RCX = (long)local_38 - (long)in_RSI;
  return 0;
}

Assistant:

int av1_pack_bitstream(AV1_COMP *const cpi, uint8_t *dst, size_t dst_size,
                       size_t *size, int *const largest_tile_id) {
  uint8_t *data = dst;
  size_t data_size = dst_size;
  AV1_COMMON *const cm = &cpi->common;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  uint32_t obu_header_size = 0;
  uint32_t obu_payload_size = 0;
  FrameHeaderInfo fh_info = { NULL, 0, 0 };
  const uint8_t obu_extension_header =
      cm->temporal_layer_id << 5 | cm->spatial_layer_id << 3 | 0;

  // If no non-zero delta_q has been used, reset delta_q_present_flag
  if (cm->delta_q_info.delta_q_present_flag && cpi->deltaq_used == 0) {
    cm->delta_q_info.delta_q_present_flag = 0;
  }

#if CONFIG_BITSTREAM_DEBUG
  bitstream_queue_reset_write();
#endif

  cpi->frame_header_count = 0;

  // The TD is now written outside the frame encode loop

  // write sequence header obu at each key frame or intra_only frame,
  // preceded by 4-byte size
  if (cm->current_frame.frame_type == INTRA_ONLY_FRAME ||
      cm->current_frame.frame_type == KEY_FRAME) {
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_SEQUENCE_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/false, 0, data);
    assert(obu_header_size <= 2);
    obu_payload_size = av1_write_sequence_header_obu(
        cm->seq_params, data + obu_header_size, data_size - obu_header_size);
    const size_t length_field_size =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field_size == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    const size_t bytes_written =
        obu_header_size + length_field_size + obu_payload_size;
    data += bytes_written;
    data_size -= bytes_written;
  }

  // write metadata obus before the frame obu that has the show_frame flag set
  if (cm->show_frame) {
    const size_t bytes_written = av1_write_metadata_array(cpi, data, data_size);
    data += bytes_written;
    data_size -= bytes_written;
  }

  const int write_frame_header =
      (cpi->num_tg > 1 || encode_show_existing_frame(cm));
  struct aom_write_bit_buffer saved_wb = { NULL, 0 };
  size_t length_field = 0;
  if (write_frame_header) {
    // Write Frame Header OBU.
    fh_info.frame_header = data;
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_FRAME_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extension_header, data);
    // TODO: bug 42302568 - Pass data_size - obu_header_size to
    // write_frame_header_obu().
    obu_payload_size = write_frame_header_obu(cpi, &cpi->td.mb.e_mbd, &saved_wb,
                                              data + obu_header_size, 1);

    length_field =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = obu_header_size + length_field + obu_payload_size;
    // Make sure it is safe to cast fh_info.total_length to uint32_t.
    if (fh_info.total_length > UINT32_MAX) {
      return AOM_CODEC_ERROR;
    }
    data += fh_info.total_length;
    data_size -= fh_info.total_length;
  }

  if (!encode_show_existing_frame(cm)) {
    // Since length_field is determined adaptively after frame header
    // encoding, saved_wb must be adjusted accordingly.
    if (saved_wb.bit_buffer != NULL) {
      saved_wb.bit_buffer += length_field;
    }

    //  Each tile group obu will be preceded by 4-byte size of the tile group
    //  obu
    const size_t bytes_written =
        write_tiles_in_tg_obus(cpi, data, data_size, &saved_wb,
                               obu_extension_header, &fh_info, largest_tile_id);
    data += bytes_written;
    data_size -= bytes_written;
  }
  *size = data - dst;
  (void)data_size;
  return AOM_CODEC_OK;
}